

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Dummy(ImVec2 *size)

{
  ImGuiWindow *size_00;
  ImRect *in_RDI;
  ImGuiWindowTempData *min;
  ImRect bb;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffffc8;
  ImVec2 local_28 [2];
  undefined4 in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  
  size_00 = GetCurrentWindow();
  if ((size_00->SkipItems & 1U) == 0) {
    min = &size_00->DC;
    local_28[0] = ::operator+(in_stack_ffffffffffffffc8,(ImVec2 *)0x2b0f6e);
    ImRect::ImRect((ImRect *)(local_28 + 1),&min->CursorPos,local_28);
    ItemSize((ImVec2 *)size_00,in_stack_ffffffffffffffec);
    ItemAdd(in_RDI,(ImGuiID)((ulong)size_00 >> 0x20),
            (ImRect *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void ImGui::Dummy(const ImVec2& size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    ItemAdd(bb, 0);
}